

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O3

void la_dgemv_nos(int m,int n,double *a,int lda,double *x,int incx,double *y,int incy)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa2,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa3,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa4,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x != y) {
    if ((lda < 1) || (lda < n)) {
      __assert_fail("lda >= 1 && lda >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0xa6,
                    "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if (incx < 1) {
      __assert_fail("incx > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0xa7,
                    "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if (0 < incy) {
      if (0 < n) {
        uVar1 = 0;
        do {
          dVar4 = 0.0;
          if (0 < m) {
            uVar3 = 0;
            pdVar2 = x;
            do {
              dVar4 = dVar4 + a[uVar3] * *pdVar2;
              uVar3 = uVar3 + 1;
              pdVar2 = pdVar2 + (uint)incx;
            } while ((uint)m != uVar3);
          }
          y[uVar1 * (uint)incy] = dVar4;
          uVar1 = uVar1 + 1;
          a = a + (uint)lda;
        } while (uVar1 != (uint)n);
      }
      return;
    }
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xa8,
                  "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("x != y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0xa5,
                "void la_dgemv_nos(int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemv_nos(
        int m, int n,
        const double *a, int lda,
        const double *x, int incx,
        double *y, int incy)
{
    assert(a);
    assert(x);
    assert(y);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);

    for (int i = 0; i < n; i++) {
        double yi = 0.0;
        for (int j = 0; j < m; j++) {
            yi += a[i * lda + j] * x[j * incx];
        }
        y[i * incy] = yi;
    }
}